

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_evp_fp_nan(void)

{
  reference_type pdVar1;
  compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_> local_10;
  opt_double o1;
  
  local_10.super_type.value_ = (type)1.0;
  pdVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_fp_nan<double>_>::value
                     (&local_10);
  if ((*pdVar1 != 1.0) || (NAN(*pdVar1))) {
    __assert_fail("o1.value() == 1.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x86,"void test_evp_fp_nan()");
  }
  if (((double)local_10.super_type.value_ == 1.0) && (!NAN((double)local_10.super_type.value_))) {
    return;
  }
  __assert_fail("v == 1.0",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x8c,"void test_evp_fp_nan()");
}

Assistant:

void test_evp_fp_nan()
{
  typedef compact_optional<evp_fp_nan<double>> opt_double;
  opt_double o_, o1 (1.0), oNan (0.0/0.0);
  assert (!o_.has_value());
  assert ( o1.has_value());
  assert (!oNan.has_value());
  
  assert (o1.value() == 1.0);
  
  double v = o_.unsafe_raw_value();
  assert (v != v);
  
  v = o1.unsafe_raw_value();
  assert (v == 1.0);
  assert (v == v);
  
  v = oNan.unsafe_raw_value();
  assert (v != v);
}